

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void finalizeAggFunctions(Parse *pParse,AggInfo *pAggInfo)

{
  Vdbe *p;
  ExprList *pEVar1;
  int p2;
  int iVar2;
  AggInfo_func *pAVar3;
  
  p = pParse->pVdbe;
  pAVar3 = pAggInfo->aFunc;
  for (iVar2 = 0; iVar2 < pAggInfo->nFunc; iVar2 = iVar2 + 1) {
    pEVar1 = (pAVar3->pExpr->x).pList;
    if (pEVar1 == (ExprList *)0x0) {
      p2 = 0;
    }
    else {
      p2 = pEVar1->nExpr;
    }
    sqlite3VdbeAddOp4(p,0x7c,pAVar3->iMem,p2,0,(char *)pAVar3->pFunc,-5);
    pAVar3 = pAVar3 + 1;
  }
  return;
}

Assistant:

static void finalizeAggFunctions(Parse *pParse, AggInfo *pAggInfo){
  Vdbe *v = pParse->pVdbe;
  int i;
  struct AggInfo_func *pF;
  for(i=0, pF=pAggInfo->aFunc; i<pAggInfo->nFunc; i++, pF++){
    ExprList *pList = pF->pExpr->x.pList;
    assert( !ExprHasProperty(pF->pExpr, EP_xIsSelect) );
    sqlite3VdbeAddOp4(v, OP_AggFinal, pF->iMem, pList ? pList->nExpr : 0, 0,
                      (void*)pF->pFunc, P4_FUNCDEF);
  }
}